

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void gen_wide_b64grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  if (7 < size) {
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = uVar3;
      if ((uVar5 & 1) == 0) {
        iVar2 = get_b64_value(mem[uVar4]);
        uVar5 = uVar5 | 1;
        uVar1 = uVar3 * 0x40 + iVar2 & 0xffffff;
        if (iVar2 < 0) {
          uVar5 = 0;
          uVar1 = uVar3;
        }
      }
      else {
        uVar5 = uVar5 + 1;
        if (mem[uVar4] != '\0') {
          uVar5 = 0;
        }
        if (7 < uVar5) {
          uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
          if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*cb->_M_invoker)((_Any_data *)cb,(uint *)((long)&uStack_38 + 4));
        }
      }
      uVar3 = uVar1;
      uVar4 = uVar4 + 1;
    } while (size != uVar4);
  }
  return;
}

Assistant:

void gen_wide_b64grams(const uint8_t *mem, uint64_t size,
                       const TrigramCallback &cb) {
    if (size < 8) {
        return;
    }

    uint32_t gram4 = 0;
    uint64_t good_run = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        if (good_run % 2 == 1) {
            if (mem[offset] == 0) {
                good_run += 1;
            } else {
                good_run = 0;
            }

            if (good_run >= 8) {
                cb(gram4);
            }
        } else {
            int next = get_b64_value(mem[offset]);
            if (next < 0) {
                good_run = 0;
            } else {
                gram4 = ((gram4 << 6) + next) & 0xFFFFFFU;
                good_run += 1;
            }
        }
    }
}